

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O0

void __thiscall xray_re::xr_surface::load_1(xr_surface *this,xr_reader *r)

{
  uint32_t uVar1;
  uint tc;
  xr_reader *r_local;
  xr_surface *this_local;
  
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::r_sz(r,&this->m_eshader);
  xr_reader::r_sz(r,&this->m_cshader);
  std::__cxx11::string::operator=((string *)&this->m_gamemtl,"default");
  xr_reader::r_sz(r,&this->m_texture);
  xr_reader::r_sz(r,&this->m_vmap);
  uVar1 = xr_reader::r_u32(r);
  this->m_flags = uVar1;
  uVar1 = xr_reader::r_u32(r);
  this->m_fvf = uVar1;
  uVar1 = xr_reader::r_u32(r);
  if (uVar1 < 2) {
    return;
  }
  __assert_fail("tc <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_surface.cxx"
                ,0x2b,"void xray_re::xr_surface::load_1(xr_reader &)");
}

Assistant:

void xr_surface::load_1(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_eshader);
	r.r_sz(m_cshader);
	m_gamemtl = "default";
	r.r_sz(m_texture);
	r.r_sz(m_vmap);
	m_flags = r.r_u32();
	m_fvf = r.r_u32();
	unsigned tc = r.r_u32();
	xr_assert(tc <= 1);
}